

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_slider.c
# Opt level: O0

void slider_size(t_slider *x,t_symbol *s,int ac,t_atom *av)

{
  int iVar1;
  t_float tVar2;
  t_float tVar3;
  int h;
  int w;
  t_atom *av_local;
  int ac_local;
  t_symbol *s_local;
  t_slider *x_local;
  
  tVar2 = atom_getfloatarg(0,ac,av);
  tVar3 = atom_getfloatarg(1,ac,av);
  if (x->x_orientation == horizontal) {
    iVar1 = slider_check_range(x,(int)tVar2 * ((x->x_gui).x_glist)->gl_zoom);
    (x->x_gui).x_w = iVar1;
    if (1 < ac) {
      iVar1 = iemgui_clip_size((int)tVar3);
      (x->x_gui).x_h = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    }
  }
  else {
    iVar1 = iemgui_clip_size((int)tVar2);
    (x->x_gui).x_w = iVar1 * ((x->x_gui).x_glist)->gl_zoom;
    if (1 < ac) {
      iVar1 = slider_check_range(x,(int)tVar3 * ((x->x_gui).x_glist)->gl_zoom);
      (x->x_gui).x_h = iVar1;
    }
  }
  iemgui_size(x,&x->x_gui);
  slider_set(x,x->x_fval);
  return;
}

Assistant:

static void slider_size(t_slider *x, t_symbol *s, int ac, t_atom *av)
{
    int w = (int)atom_getfloatarg(0, ac, av);
    int h = (int)atom_getfloatarg(1, ac, av);
    if(x->x_orientation == horizontal)
    {
        x->x_gui.x_w = slider_check_range(x, w*IEMGUI_ZOOM(x));
        if(ac > 1)
            x->x_gui.x_h = iemgui_clip_size(h) * IEMGUI_ZOOM(x);
    } else {
        x->x_gui.x_w = iemgui_clip_size(w) * IEMGUI_ZOOM(x);
        if(ac > 1)
            x->x_gui.x_h = slider_check_range(x, h*IEMGUI_ZOOM(x));
    }
    iemgui_size((void *)x, &x->x_gui);
    slider_set(x, x->x_fval);
}